

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscribedsignal.cpp
# Opt level: O2

void __thiscall
hbm::streaming::SubscribedSignal::setDataFormat(SubscribedSignal *this,Value *params)

{
  bool bVar1;
  UInt UVar2;
  Value *pVVar3;
  runtime_error *prVar4;
  bool bVar5;
  pattern_t pVar6;
  dataType_t dVar7;
  size_t sVar8;
  size_t sStack_a0;
  string dataValueType;
  string endianness;
  string dataFormatPattern;
  string dataTimeType;
  
  pVVar3 = Json::Value::operator[](params,"pattern");
  Json::Value::asString_abi_cxx11_(&dataFormatPattern,pVVar3);
  bVar1 = std::operator==(&dataFormatPattern,"V");
  pVar6 = PATTERN_V;
  if (!bVar1) {
    bVar1 = std::operator==(&dataFormatPattern,"TV");
    if (bVar1) {
      pVar6 = PATTERN_TV;
    }
    else {
      bVar1 = std::operator==(&dataFormatPattern,"TB");
      if (!bVar1) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,"invalid data pattern");
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pVar6 = PATTERN_TB;
    }
  }
  this->m_dataFormatPattern = pVar6;
  pVVar3 = Json::Value::operator[](params,"endian");
  Json::Value::asString_abi_cxx11_(&endianness,pVVar3);
  bVar1 = std::operator==(&endianness,"big");
  bVar5 = true;
  if (!bVar1) {
    bVar1 = std::operator==(&endianness,"little");
    if (!bVar1) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"invalid endianness");
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar5 = false;
  }
  this->m_dataIsBigEndian = bVar5;
  pVVar3 = Json::Value::operator[](params,"valueType");
  Json::Value::asString_abi_cxx11_(&dataValueType,pVVar3);
  bVar1 = std::operator==(&dataValueType,"real32");
  sVar8 = 4;
  if (bVar1) {
    dVar7 = DATATYPE_REAL32;
  }
  else {
    bVar1 = std::operator==(&dataValueType,"u32");
    dVar7 = DATATYPE_U32;
    if (!bVar1) {
      bVar1 = std::operator==(&dataValueType,"s32");
      if (bVar1) {
        dVar7 = DATATYPE_S32;
      }
      else {
        bVar1 = std::operator==(&dataValueType,"real64");
        sStack_a0 = 8;
        sVar8 = 8;
        if (bVar1) {
          dVar7 = DATATYPE_REAL64;
          sVar8 = sStack_a0;
        }
        else {
          bVar1 = std::operator==(&dataValueType,"u64");
          if (bVar1) {
            dVar7 = DATATYPE_U64;
          }
          else {
            bVar1 = std::operator==(&dataValueType,"s64");
            if (bVar1) {
              dVar7 = DATATYPE_S64;
            }
            else {
              bVar1 = std::operator==(&dataValueType,"CanRaw");
              if (!bVar1) {
                prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar4,"invalid value type");
                __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              sVar8 = 1;
              dVar7 = DATATYPE_CANRAW;
            }
          }
        }
      }
    }
  }
  this->m_dataValueType = dVar7;
  this->m_dataValueSize = sVar8;
  pVVar3 = Json::Value::operator[](params,"time");
  pVVar3 = Json::Value::operator[](pVVar3,"type");
  Json::Value::asString_abi_cxx11_(&dataTimeType,pVVar3);
  bVar1 = std::operator==(&dataTimeType,"ntp");
  if (bVar1) {
    this->m_dataTimeType = TIMETYPE_NTP;
  }
  pVVar3 = Json::Value::operator[](params,"time");
  pVVar3 = Json::Value::operator[](pVVar3,"size");
  UVar2 = Json::Value::asUInt(pVVar3);
  this->m_dataTimeSize = (ulong)UVar2;
  std::__cxx11::string::~string((string *)&dataTimeType);
  std::__cxx11::string::~string((string *)&dataValueType);
  std::__cxx11::string::~string((string *)&endianness);
  std::__cxx11::string::~string((string *)&dataFormatPattern);
  return;
}

Assistant:

void SubscribedSignal::setDataFormat(const Json::Value& params)
		{
			std::string dataFormatPattern = params["pattern"].asString();
			if(dataFormatPattern=="V") {
				m_dataFormatPattern = PATTERN_V;
			} else if(dataFormatPattern=="TV"){
				m_dataFormatPattern = PATTERN_TV;
			} else if(dataFormatPattern=="TB"){
				m_dataFormatPattern = PATTERN_TB;
			} else {
				throw std::runtime_error("invalid data pattern");
			}

			std::string endianness = params["endian"].asString();
			if(endianness=="big") {
				m_dataIsBigEndian = true;
			} else if(endianness=="little") {
				m_dataIsBigEndian = false;
			} else {
				throw std::runtime_error("invalid endianness");
			}
			std::string dataValueType = params["valueType"].asString();
			if(dataValueType=="real32") {
				m_dataValueType = DATATYPE_REAL32;
				m_dataValueSize = 4;
			} else if(dataValueType=="u32") {
				m_dataValueType = DATATYPE_U32;
				m_dataValueSize = 4;
			} else if(dataValueType=="s32") {
				m_dataValueType = DATATYPE_S32;
				m_dataValueSize = 4;
			} else if(dataValueType=="real64") {
				m_dataValueType = DATATYPE_REAL64;
				m_dataValueSize = 8;
			} else if(dataValueType=="u64") {
				m_dataValueType = DATATYPE_U64;
				m_dataValueSize = 8;
			} else if(dataValueType=="s64") {
				m_dataValueType = DATATYPE_S64;
				m_dataValueSize = 8;
            } else if(dataValueType == "CanRaw") {
                m_dataValueType = DATATYPE_CANRAW;
                m_dataValueSize = 1;
			} else {
				throw std::runtime_error("invalid value type");
			}


			std::string dataTimeType = params["time"]["type"].asString();
			if(dataTimeType=="ntp") {
				m_dataTimeType = TIMETYPE_NTP;
			}

			m_dataTimeSize = params["time"]["size"].asUInt();

		}